

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,string_view input,bool cap_next_letter)

{
  cpp cVar1;
  cpp *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (cpp *)0x0) {
    pcVar2 = (cpp *)0x0;
    do {
      cVar1 = pcVar2[input._M_len];
      if (((byte)((char)cVar1 + 0x9fU) < 0x1a) || ((byte)((char)cVar1 + 0xbfU) < 0x1a)) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else if ((byte)((char)cVar1 - 0x30U) < 10) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar2 = pcVar2 + 1;
    } while (this != pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(absl::string_view input,
                                   bool cap_next_letter) {
  std::string result;
  // Note:  I distrust ctype.h due to locales.
  for (size_t i = 0; i < input.size(); ++i) {
    if ('a' <= input[i] && input[i] <= 'z') {
      if (cap_next_letter) {
        result += input[i] + ('A' - 'a');
      } else {
        result += input[i];
      }
      cap_next_letter = false;
    } else if ('A' <= input[i] && input[i] <= 'Z') {
      // Capital letters are left as-is.
      result += input[i];
      cap_next_letter = false;
    } else if ('0' <= input[i] && input[i] <= '9') {
      result += input[i];
      cap_next_letter = true;
    } else {
      cap_next_letter = true;
    }
  }
  return result;
}